

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::ReadFirewirePhy(FpgaIO *this,uchar addr,uchar *data)

{
  BasePort *pBVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined4 local_30;
  uint uStack_2c;
  uchar read_addr;
  quadlet_t read_data;
  quadlet_t write_data;
  uchar *data_local;
  FpgaIO *pFStack_18;
  uchar addr_local;
  FpgaIO *this_local;
  
  _read_data = data;
  data_local._7_1_ = addr;
  pFStack_18 = this;
  if (addr < 0x10) {
    uStack_2c = (uint)addr;
    local_30 = 0;
    pBVar1 = (this->super_BoardIO).port;
    uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,1,(ulong)uStack_2c);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pBVar1 = (this->super_BoardIO).port;
      uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,2,&local_30);
      if ((uVar3 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = (byte)((uint)local_30 >> 8) & 0xf;
        if (bVar2 == data_local._7_1_) {
          *_read_data = (uchar)local_30;
          this_local._7_1_ = true;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"ReadFirewirePhy: read addr ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
          poVar4 = std::operator<<(poVar4,", expected ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,(uint)data_local._7_1_);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"ReadFirewirePhy: invalid addr ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,(uint)data_local._7_1_);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::ReadFirewirePhy(unsigned char addr, unsigned char &data)
{
    if (addr > 15) {
        std::cout << "ReadFirewirePhy: invalid addr "
                  << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    quadlet_t write_data = addr;
    quadlet_t read_data = 0;
    if (!port->WriteQuadlet(BoardId, BoardIO::FW_PHY_REQ, write_data))
        return false;
    if (!port->ReadQuadlet(BoardId, BoardIO::FW_PHY_RESP, read_data))
        return false;
    // Register address in read response is bits 11-8
    unsigned char read_addr = static_cast<unsigned char>(read_data>>8) & 0x0f;
    // Check that it matches the request address
    if (read_addr != addr) {
        std::cout << "ReadFirewirePhy: read addr " << static_cast<unsigned int>(read_addr)
                  << ", expected " << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    data = static_cast<unsigned char>(read_data);
    return true;
}